

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void p_glow2(obj *otmp,char *color)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *local_50;
  char *color_local;
  obj *otmp_local;
  
  pcVar1 = xname(otmp);
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar4 = false;
    if (ublindf != (obj *)0x0) {
      bVar4 = ublindf->oartifact == '\x1d';
    }
    bVar4 = (bool)(bVar4 ^ 1);
  }
  pcVar3 = "glow";
  if (bVar4) {
    pcVar3 = "vibrate";
  }
  pcVar3 = otense(otmp,pcVar3);
  if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
     (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
    bVar4 = false;
    if (ublindf != (obj *)0x0) {
      bVar4 = ublindf->oartifact == '\x1d';
    }
    bVar4 = (bool)(bVar4 ^ 1);
  }
  pcVar2 = " ";
  if (bVar4) {
    pcVar2 = "";
  }
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    local_50 = hcolor(color);
  }
  else {
    local_50 = "";
  }
  pline("Your %s %s%s%s for a moment.",pcVar1,pcVar3,pcVar2,local_50);
  return;
}

Assistant:

static void p_glow2(struct obj *otmp, const char *color)
{
	pline("Your %s %s%s%s for a moment.",
		xname(otmp),
		otense(otmp, Blind ? "vibrate" : "glow"),
		Blind ? "" : " ",
		Blind ? nul : hcolor(color));
}